

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O0

void __thiscall
Corrade::Containers::StridedArrayView<4U,_char>::StridedArrayView
          (StridedArrayView<4U,_char> *this,ArrayView<void> data,char *member,Size<4U> *size,
          Stride<4U> *stride)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  anon_class_24_3_a165bac9 local_58;
  Stride<4U> *local_38;
  Stride<4U> *stride_local;
  Size<4U> *size_local;
  char *member_local;
  StridedArrayView<4U,_char> *this_local;
  ArrayView<void> data_local;
  
  data_local._data = (void *)data._size;
  this_local = (StridedArrayView<4U,_char> *)data._data;
  local_38 = stride;
  stride_local = (Stride<4U> *)size;
  size_local = (Size<4U> *)member;
  member_local = (char *)this;
  bVar1 = Implementation::isAnyDimensionZero<4u,unsigned_long,0ul,1ul,2ul,3ul>(size);
  if (!bVar1) {
    sVar2 = Implementation::largestStride<4u,0ul,1ul,2ul,3ul>(stride_local,local_38);
    sVar3 = ArrayView<void>::size((ArrayView<void> *)&this_local);
    if (sVar3 < sVar2) {
      local_58.data = (ArrayView<void> *)&this_local;
      local_58.size = (Size<4U> *)stride_local;
      local_58.stride = local_38;
      StridedArrayView::anon_class_24_3_a165bac9::operator()(&local_58);
    }
  }
  this->_data = size_local;
  (this->_size)._data[0] = stride_local->_data[0];
  (this->_size)._data[1] = stride_local->_data[1];
  (this->_size)._data[2] = stride_local->_data[2];
  (this->_size)._data[3] = stride_local->_data[3];
  (this->_stride)._data[0] = local_38->_data[0];
  (this->_stride)._data[1] = local_38->_data[1];
  (this->_stride)._data[2] = local_38->_data[2];
  (this->_stride)._data[3] = local_38->_data[3];
  return;
}

Assistant:

constexpr StridedArrayView<dimensions, T>::StridedArrayView(ArrayView<ErasedType> data, T* member, const Containers::Size<dimensions>& size, const Containers::Stride<dimensions>& stride) noexcept: _data{(
    /* A strided array view is usually not created from scratch in tight loops
       (except for slicing, which uses a different constructor) and should be
       as checked as possible, so it's not a debug assert */
    /** @todo can't compare void pointers to check if member is in data, it's
        not constexpr :( */
    /* If any size is zero, data can be zero-sized too. If the largest stride
       is zero, `data` can have *any* size and it could be okay, can't reliably
       test that */
    CORRADE_CONSTEXPR_ASSERT(Implementation::isAnyDimensionZero(size._data, typename Implementation::GenerateSequence<dimensions>::Type{}) || Implementation::largestStride(size._data, stride._data, typename Implementation::GenerateSequence<dimensions>::Type{}) <= data.size(),
        "Containers::StridedArrayView: data size" << data.size() << "is not enough for" << size << "elements of stride" << stride),
    #ifdef CORRADE_NO_ASSERT
    static_cast<void>(data),
    #endif
    member)}, _size{size}, _stride{stride} {}